

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

ASN1_OCTET_STRING * a2i_IPADDRESS(char *ipasc)

{
  int iVar1;
  int iplen;
  ASN1_OCTET_STRING *ret;
  uchar ipout [16];
  char *ipasc_local;
  
  ipout._8_8_ = ipasc;
  iVar1 = x509v3_a2i_ipadd((uint8_t *)&ret,ipasc);
  if (iVar1 == 0) {
    ipasc_local = (char *)0x0;
  }
  else {
    ipasc_local = (char *)ASN1_OCTET_STRING_new();
    if ((ASN1_OCTET_STRING *)ipasc_local == (ASN1_OCTET_STRING *)0x0) {
      ipasc_local = (char *)0x0;
    }
    else {
      iVar1 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)ipasc_local,(uchar *)&ret,iVar1);
      if (iVar1 == 0) {
        ASN1_OCTET_STRING_free((ASN1_OCTET_STRING *)ipasc_local);
        ipasc_local = (char *)0x0;
      }
    }
  }
  return (ASN1_OCTET_STRING *)ipasc_local;
}

Assistant:

ASN1_OCTET_STRING *a2i_IPADDRESS(const char *ipasc) {
  unsigned char ipout[16];
  ASN1_OCTET_STRING *ret;
  int iplen;

  iplen = x509v3_a2i_ipadd(ipout, ipasc);
  if (!iplen) {
    return NULL;
  }

  ret = ASN1_OCTET_STRING_new();
  if (!ret) {
    return NULL;
  }
  if (!ASN1_OCTET_STRING_set(ret, ipout, iplen)) {
    ASN1_OCTET_STRING_free(ret);
    return NULL;
  }
  return ret;
}